

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Soccer.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_7b7f9::MicTestPlugIn::update
          (MicTestPlugIn *this,float currentTime,float elapsedTime)

{
  AABBox *pAVar1;
  Vec3 p;
  Vec3 p_00;
  Vec3 p_01;
  Vec3 p_02;
  bool bVar2;
  reference ppPVar3;
  Ball *in_RDI;
  uint in_XMM0_Da;
  undefined8 uVar4;
  float in_XMM1_Da;
  uint i_1;
  uint i;
  float local_18;
  float local_14;
  
  for (local_14 = 0.0;
      (uint)local_14 <
      (uint)(in_RDI->super_SimpleVehicle).super_SimpleVehicle_3.
            super_AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>.
            super_LocalSpaceMixin<OpenSteer::AbstractVehicle>._side.x;
      local_14 = (float)((int)local_14 + 1)) {
    ppPVar3 = std::
              vector<(anonymous_namespace)::Player_*,_std::allocator<(anonymous_namespace)::Player_*>_>
              ::operator[]((vector<(anonymous_namespace)::Player_*,_std::allocator<(anonymous_namespace)::Player_*>_>
                            *)&(in_RDI->super_SimpleVehicle).super_SimpleVehicle_3.
                               super_AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>
                               .super_LocalSpaceMixin<OpenSteer::AbstractVehicle>._side.z,
                           (ulong)(uint)local_14);
    (*((*ppPVar3)->super_SimpleVehicle).super_SimpleVehicle_3.
      super_AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>.
      super_LocalSpaceMixin<OpenSteer::AbstractVehicle>.super_AbstractVehicle.
      super_AbstractLocalSpace._vptr_AbstractLocalSpace[0x22])((ulong)in_XMM0_Da,in_XMM1_Da);
  }
  for (local_18 = 0.0;
      (uint)local_18 <
      (uint)(in_RDI->super_SimpleVehicle).super_SimpleVehicle_3.
            super_AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>.
            super_LocalSpaceMixin<OpenSteer::AbstractVehicle>._side.y;
      local_18 = (float)((int)local_18 + 1)) {
    ppPVar3 = std::
              vector<(anonymous_namespace)::Player_*,_std::allocator<(anonymous_namespace)::Player_*>_>
              ::operator[]((vector<(anonymous_namespace)::Player_*,_std::allocator<(anonymous_namespace)::Player_*>_>
                            *)&(in_RDI->super_SimpleVehicle).super_SimpleVehicle_3.
                               super_AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>
                               .super_LocalSpaceMixin<OpenSteer::AbstractVehicle>._forward.z,
                           (ulong)(uint)local_18);
    (*((*ppPVar3)->super_SimpleVehicle).super_SimpleVehicle_3.
      super_AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>.
      super_LocalSpaceMixin<OpenSteer::AbstractVehicle>.super_AbstractVehicle.
      super_AbstractLocalSpace._vptr_AbstractLocalSpace[0x22])((ulong)in_XMM0_Da,in_XMM1_Da);
  }
  (**(code **)(**(long **)&(in_RDI->super_SimpleVehicle).super_SimpleVehicle_3.
                           super_AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>
                           .curPosition.z + 0x110))(in_XMM0_Da);
  pAVar1 = (AABBox *)
           (in_RDI->super_SimpleVehicle).super_SimpleVehicle_3.
           super_AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>.trailFlags
  ;
  uVar4 = (**(code **)(**(long **)&(in_RDI->super_SimpleVehicle).super_SimpleVehicle_3.
                                   super_AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>
                                   .curPosition.z + 0x40))();
  p_02.z = in_XMM1_Da;
  p_02.x = (float)(int)uVar4;
  p_02.y = (float)(int)((ulong)uVar4 >> 0x20);
  bVar2 = AABBox::InsideX(pAVar1,p_02);
  if (bVar2) {
    pAVar1 = (AABBox *)
             (in_RDI->super_SimpleVehicle).super_SimpleVehicle_3.
             super_AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>.
             trailFlags;
    uVar4 = (**(code **)(**(long **)&(in_RDI->super_SimpleVehicle).super_SimpleVehicle_3.
                                     super_AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>
                                     .curPosition.z + 0x40))();
    p_01.z = in_XMM1_Da;
    p_01.x = (float)(int)uVar4;
    p_01.y = (float)(int)((ulong)uVar4 >> 0x20);
    bVar2 = AABBox::InsideZ(pAVar1,p_01);
    if (bVar2) {
      Ball::reset(in_RDI);
      (in_RDI->super_SimpleVehicle).super_SimpleVehicle_3.hisPositionAtNearestApproach.y =
           (float)((int)(in_RDI->super_SimpleVehicle).super_SimpleVehicle_3.
                        hisPositionAtNearestApproach.y + 1);
    }
  }
  pAVar1 = *(AABBox **)&(in_RDI->super_SimpleVehicle).super_SimpleVehicle_3.WanderSide;
  uVar4 = (**(code **)(**(long **)&(in_RDI->super_SimpleVehicle).super_SimpleVehicle_3.
                                   super_AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>
                                   .curPosition.z + 0x40))();
  p_00.z = in_XMM1_Da;
  p_00.x = (float)(int)uVar4;
  p_00.y = (float)(int)((ulong)uVar4 >> 0x20);
  bVar2 = AABBox::InsideX(pAVar1,p_00);
  if (bVar2) {
    pAVar1 = *(AABBox **)&(in_RDI->super_SimpleVehicle).super_SimpleVehicle_3.WanderSide;
    uVar4 = (**(code **)(**(long **)&(in_RDI->super_SimpleVehicle).super_SimpleVehicle_3.
                                     super_AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>
                                     .curPosition.z + 0x40))();
    p.z = in_XMM1_Da;
    p.x = (float)(int)uVar4;
    p.y = (float)(int)((ulong)uVar4 >> 0x20);
    bVar2 = AABBox::InsideZ(pAVar1,p);
    if (bVar2) {
      Ball::reset(in_RDI);
      (in_RDI->super_SimpleVehicle).super_SimpleVehicle_3.hisPositionAtNearestApproach.z =
           (float)((int)(in_RDI->super_SimpleVehicle).super_SimpleVehicle_3.
                        hisPositionAtNearestApproach.z + 1);
    }
  }
  return;
}

Assistant:

void update (const float currentTime, const float elapsedTime)
        {
            // update simulation of test vehicle
            for(unsigned int i=0; i < m_PlayerCountA ; i++)
                TeamA[i]->update (currentTime, elapsedTime);
            for(unsigned int i=0; i < m_PlayerCountB ; i++)
                TeamB[i]->update (currentTime, elapsedTime);
            m_Ball->update(currentTime, elapsedTime);

            if(m_TeamAGoal->InsideX(m_Ball->position()) && m_TeamAGoal->InsideZ(m_Ball->position()))
            {
                m_Ball->reset();	// Ball in blue teams goal, red scores
                m_redScore++;
            }
            if(m_TeamBGoal->InsideX(m_Ball->position()) && m_TeamBGoal->InsideZ(m_Ball->position()))
            {
                m_Ball->reset();	// Ball in red teams goal, blue scores
                    m_blueScore++;
            }

        }